

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O0

void __thiscall glslopt_shader::~glslopt_shader(glslopt_shader *this)

{
  uint local_14;
  uint i;
  glslopt_shader *this_local;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    ralloc_free(this->whole_program->_LinkedShaders[local_14]);
  }
  ralloc_free(this->whole_program);
  ralloc_free(this->rawOutput);
  ralloc_free(this->optimizedOutput);
  return;
}

Assistant:

~glslopt_shader()
	{
		for (unsigned i = 0; i < MESA_SHADER_STAGES; i++)
			ralloc_free(whole_program->_LinkedShaders[i]);
		ralloc_free(whole_program);
		ralloc_free(rawOutput);
		ralloc_free(optimizedOutput);
	}